

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  int iVar1;
  int iVar2;
  void *in_RDI;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  int ret;
  secp256k1_fe *in_stack_000001c8;
  secp256k1_fe *in_stack_000001d0;
  secp256k1_fe *in_stack_ffffffffffffff90;
  undefined1 local_40 [52];
  int local_c;
  
  memcpy(local_40,in_RDI,0x30);
  secp256k1_fe_verify(in_stack_ffffffffffffff90);
  local_c = secp256k1_fe_impl_is_square_var((secp256k1_fe *)sqrt.n[2]);
  secp256k1_fe_normalize_weak((secp256k1_fe *)0x1355ff);
  iVar1 = local_c;
  iVar2 = secp256k1_fe_sqrt(in_stack_000001d0,in_stack_000001c8);
  if (iVar1 != iVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x1ab,"test condition failed: ret == secp256k1_fe_sqrt(&sqrt, &tmp)");
    abort();
  }
  return local_c;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}